

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::ReadChannelInfo
               (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  bool bVar1;
  size_type sVar2;
  uchar *puVar3;
  value_type *__x;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  uchar *data_end;
  tinyexr_int64 data_len;
  ChannelInfo info;
  char *p;
  size_type in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *paVar5;
  value_type *this;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_30;
  int local_2c;
  undefined1 local_28;
  value_type *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  local_20 = (value_type *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  do {
    if ((local_20->name)._M_dataplus == (_Alloc_hider)0x0) {
      local_1 = 1;
      break;
    }
    TChannelInfo::TChannelInfo((TChannelInfo *)0x46471f);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
    this = local_20;
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x46474b);
    if ((long)(sVar2 - ((long)this - (long)puVar3)) < 0) {
      local_1 = 0;
      bVar1 = true;
    }
    else {
      __x = (value_type *)
            ReadString((string *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_20 = __x;
      if ((__x == (value_type *)0x0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
        local_1 = 0;
        bVar1 = true;
      }
      else {
        paVar5 = &(local_20->name).field_2;
        puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x464820);
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
        if (paVar5 < puVar3 + sVar2) {
          in_stack_ffffffffffffffc8 = *(int *)&local_20->name;
          local_28 = (local_20->name).field_0x4;
          local_30 = (int)(local_20->name)._M_string_length;
          local_2c = *(int *)((long)&(local_20->name)._M_string_length + 4);
          local_20 = (value_type *)&(local_20->name).field_2;
          swap4((int *)&stack0xffffffffffffffc8);
          swap4(&local_30);
          swap4(&local_2c);
          std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::push_back
                    ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)this,
                     __x);
          bVar1 = false;
        }
        else {
          local_1 = 0;
          bVar1 = true;
        }
      }
    }
    TChannelInfo::~TChannelInfo((TChannelInfo *)0x46492f);
  } while (!bVar1);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ReadChannelInfo(std::vector<ChannelInfo> &channels,
                            const std::vector<unsigned char> &data) {
  const char *p = reinterpret_cast<const char *>(&data.at(0));

  for (;;) {
    if ((*p) == 0) {
      break;
    }
    ChannelInfo info;

    tinyexr_int64 data_len = static_cast<tinyexr_int64>(data.size()) -
                             (p - reinterpret_cast<const char *>(data.data()));
    if (data_len < 0) {
      return false;
    }

    p = ReadString(&info.name, p, size_t(data_len));
    if ((p == NULL) && (info.name.empty())) {
      // Buffer overrun. Issue #51.
      return false;
    }

    const unsigned char *data_end =
        reinterpret_cast<const unsigned char *>(p) + 16;
    if (data_end >= (data.data() + data.size())) {
      return false;
    }

    memcpy(&info.pixel_type, p, sizeof(int));
    p += 4;
    info.p_linear = static_cast<unsigned char>(p[0]);  // uchar
    p += 1 + 3;                                        // reserved: uchar[3]
    memcpy(&info.x_sampling, p, sizeof(int));          // int
    p += 4;
    memcpy(&info.y_sampling, p, sizeof(int));  // int
    p += 4;

    tinyexr::swap4(&info.pixel_type);
    tinyexr::swap4(&info.x_sampling);
    tinyexr::swap4(&info.y_sampling);

    channels.push_back(info);
  }

  return true;
}